

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_string(dmr_C *C,expression *expr)

{
  uint value;
  int iVar1;
  expression_list *peVar2;
  symbol *psVar3;
  symbol *psVar4;
  expression *peVar5;
  expression *peVar6;
  uint length;
  expression *initstr;
  expression *addr;
  symbol *array;
  symbol *sym;
  expression *expr_local;
  dmr_C *C_local;
  
  peVar2 = (expression_list *)dmrC_alloc_symbol(C->S,expr->pos,3);
  psVar3 = dmrC_alloc_symbol(C->S,expr->pos,6);
  psVar4 = (symbol *)dmrC_alloc_expression(C,expr->pos,3);
  peVar5 = dmrC_alloc_expression(C,expr->pos,2);
  value = (uint)*(expr->field_5).field_2.string & 0x7fffffff;
  peVar6 = dmrC_alloc_const_expression(C,expr->pos,value);
  peVar2->list_[7] = peVar6;
  iVar1 = dmrC_bytes_to_bits(C->target,value);
  *(int *)(peVar2->list_ + 6) = iVar1;
  peVar2->list_[9] = (expression *)0x1;
  *(uint *)((long)peVar2->list_ + 0x34) =
       *(uint *)((long)peVar2->list_ + 0x34) & 0xff7fffff | 0x800000;
  peVar2->list_[8] = (expression *)0x4;
  peVar2->list_[0xc] = (expression *)psVar3;
  peVar2->list_[0x12] = peVar5;
  peVar5->ctype = (symbol *)peVar2;
  (peVar5->field_5).field_2.string = (expr->field_5).field_2.string;
  (psVar3->field_14).field_0.used_in = (scope *)peVar2->list_[7];
  iVar1 = dmrC_bytes_to_bits(C->target,value);
  (psVar3->field_14).field_1.normal = iVar1;
  (psVar3->field_14).field_2.ctype.alignment = 1;
  (psVar3->field_14).field_2.ctype.modifiers = 4;
  (psVar3->field_14).field_2.ctype.base_type = &C->S->char_ctype;
  ((anon_union_32_18_55d8ca1e_for_expression_5 *)&psVar4->next_id)->expr_list = peVar2;
  *(symbol **)&(psVar4->endpos).field_0x4 = &C->S->lazy_ptr_ctype;
  *(ushort *)expr = *(ushort *)expr & 0xff00 | 9;
  expr->op = 0x2a;
  (expr->field_5).field_4.symbol = psVar4;
  expr->ctype = (symbol *)peVar2;
  return (symbol *)peVar2;
}

Assistant:

static struct symbol *evaluate_string(struct dmr_C *C, struct expression *expr)
{
	struct symbol *sym = dmrC_alloc_symbol(C->S, expr->pos, SYM_NODE);
	struct symbol *array = dmrC_alloc_symbol(C->S, expr->pos, SYM_ARRAY);
	struct expression *addr = dmrC_alloc_expression(C, expr->pos, EXPR_SYMBOL);
	struct expression *initstr = dmrC_alloc_expression(C, expr->pos, EXPR_STRING);
	unsigned int length = expr->string->length;

	sym->array_size = dmrC_alloc_const_expression(C, expr->pos, length);
	sym->bit_size = dmrC_bytes_to_bits(C->target, length);
	sym->ctype.alignment = 1;
	sym->string = 1;
	sym->ctype.modifiers = MOD_STATIC;
	sym->ctype.base_type = array;
	sym->initializer = initstr;

	initstr->ctype = sym;
	initstr->string = expr->string;

	array->array_size = sym->array_size;
	array->bit_size = dmrC_bytes_to_bits(C->target, length);
	array->ctype.alignment = 1;
	array->ctype.modifiers = MOD_STATIC;
	array->ctype.base_type = &C->S->char_ctype;
	
	addr->symbol = sym;
	addr->ctype = &C->S->lazy_ptr_ctype;

	expr->type = EXPR_PREOP;
	expr->op = '*';
	expr->unop = addr;  
	expr->ctype = sym;
	return sym;
}